

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O3

void __thiscall pixels::fillDead(pixels *this)

{
  pointer puVar1;
  pointer pfVar2;
  pointer puVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  
  iVar5 = this->_h;
  if (0 < iVar5) {
    puVar1 = (this->i).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar2 = (this->f).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (this->h).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar6 = this->_w;
    iVar4 = 0;
    do {
      if (0 < iVar6) {
        iVar5 = 0;
        do {
          lVar7 = (long)(this->_stride_x * iVar4 + iVar5);
          puVar1[lVar7] = 0xdeadbeef;
          pfVar2[lVar7] = -6.2598534e+18;
          puVar3[lVar7] = 0xdead;
          lVar8 = 0x58;
          do {
            *(undefined2 *)(*(long *)((long)this->rgba + lVar8 + -0x58) + lVar7 * 2) = 0xdead;
            lVar8 = lVar8 + 0x18;
          } while (lVar8 != 0xb8);
          iVar5 = iVar5 + 1;
          iVar6 = this->_w;
        } while (iVar5 < iVar6);
        iVar5 = this->_h;
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 < iVar5);
  }
  return;
}

Assistant:

void fillDead ()
    {
        for (int y = 0; y < _h; ++y)
        {
            for (int x = 0; x < _w; ++x)
            {
                size_t idx = y * _stride_x + x;
                i[idx]     = 0xDEADBEEF;
                union
                {
                    uint32_t iv;
                    float    fv;
                } tmp;
                tmp.iv = 0xDEADBEEF;
                f[idx] = tmp.fv;
                h[idx] = 0xDEAD;
                for (int c = 0; c < 4; ++c)
                    rgba[c][idx] = 0xDEAD;
            }
        }
    }